

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *rootLG,DirectoryTarget *dt,char *pass,bool check_all,
          bool check_relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  pointer pTVar1;
  cmGeneratorTarget *this_01;
  pointer pDVar2;
  bool bVar3;
  ostream *os;
  string *psVar4;
  cmLocalUnixMakefileGenerator3 *this_02;
  Dir *d;
  pointer pDVar5;
  pointer pTVar6;
  bool bVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  string tname;
  string doc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  size_t local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  size_t local_c0;
  char *local_b8;
  string local_b0;
  string local_90;
  cmLocalUnixMakefileGenerator3 *local_70;
  ostream *local_68;
  cmGlobalUnixMakefileGenerator3 *local_60;
  DirectoryTarget *local_58;
  string makeTarget;
  
  this_00 = (cmLocalUnixMakefileGenerator3 *)dt->LG;
  local_70 = rootLG;
  local_68 = ruleFileStream;
  local_60 = this;
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this_00);
  local_e0._M_str = (psVar4->_M_dataplus)._M_p;
  local_e0._M_len = psVar4->_M_string_length;
  doc._M_string_length = (size_type)&doc.field_2;
  doc._M_dataplus._M_p = &DAT_00000001;
  doc.field_2._M_local_buf[0] = '/';
  local_d0 = 1;
  local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)doc._M_string_length;
  local_c0 = strlen(pass);
  views._M_len = 3;
  views._M_array = &local_e0;
  local_b8 = pass;
  cmCatViews_abi_cxx11_(&makeTarget,views);
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar6 = (dt->Targets).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (dt->Targets).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = dt;
  do {
    if (pTVar6 == pTVar1) {
      pDVar2 = (local_58->Children).
               super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pDVar5 = (local_58->Children).
                    super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
                    ._M_impl.super__Vector_impl_data._M_start; pDVar5 != pDVar2; pDVar5 = pDVar5 + 1
          ) {
        if ((!check_all) || (pDVar5->ExcludeFromAll == false)) {
          local_e0._M_str = (pDVar5->Path)._M_dataplus._M_p;
          local_e0._M_len = (pDVar5->Path)._M_string_length;
          doc._M_dataplus._M_p = &DAT_00000001;
          doc._M_string_length = (size_type)&doc.field_2;
          doc.field_2._M_local_buf[0] = '/';
          local_d0 = 1;
          local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)doc._M_string_length;
          local_c0 = strlen(pass);
          views_01._M_len = 3;
          views_01._M_array = &local_e0;
          local_b8 = pass;
          cmCatViews_abi_cxx11_(&tname,views_01);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                     &tname);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)tname._M_dataplus._M_p != &tname.field_2) {
            operator_delete(tname._M_dataplus._M_p,tname.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if ((depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         ((local_60->EmptyRuleHackDepends)._M_string_length != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&local_60->EmptyRuleHackDepends);
      }
      doc._M_dataplus._M_p = (pointer)&doc.field_2;
      doc._M_string_length = 0;
      doc.field_2._M_local_buf[0] = '\0';
      bVar7 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this_00);
      os = local_68;
      if (bVar7) {
        local_d0 = strlen(pass);
        local_e0._M_len = 0x14;
        local_e0._M_str = "The main recursive \"";
        local_c0 = 9;
        local_b8 = "\" target.";
        views_02._M_len = 3;
        views_02._M_array = &local_e0;
        local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pass;
        cmCatViews_abi_cxx11_(&tname,views_02);
      }
      else {
        local_d0 = strlen(pass);
        local_e0._M_len = 0xb;
        local_e0._M_str = "Recursive \"";
        local_c0 = 0x13;
        local_b8 = "\" directory target.";
        views_03._M_len = 3;
        views_03._M_array = &local_e0;
        local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pass;
        cmCatViews_abi_cxx11_(&tname,views_03);
      }
      std::__cxx11::string::operator=((string *)&doc,(string *)&tname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tname._M_dataplus._M_p != &tname.field_2) {
        operator_delete(tname._M_dataplus._M_p,tname.field_2._M_allocated_capacity + 1);
      }
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (local_70,os,doc._M_dataplus._M_p,&makeTarget,&depends,commands,true,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)doc._M_dataplus._M_p != &doc.field_2) {
        operator_delete(doc._M_dataplus._M_p,
                        CONCAT71(doc.field_2._M_allocated_capacity._1_7_,doc.field_2._M_local_buf[0]
                                ) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)makeTarget._M_dataplus._M_p != &makeTarget.field_2) {
        operator_delete(makeTarget._M_dataplus._M_p,makeTarget.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    if (check_all) {
      bVar7 = (pTVar6->ExcludedFromAllInConfigs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (pTVar6->ExcludedFromAllInConfigs).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (!check_relink || !bVar7) goto LAB_00425824;
LAB_004257f7:
      this_01 = pTVar6->GT;
      cmLocalUnixMakefileGenerator3::GetConfigName_abi_cxx11_(&local_b0,this_00);
      bVar7 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_01,&local_b0);
      bVar3 = true;
    }
    else {
      if (check_relink) goto LAB_004257f7;
      bVar7 = true;
LAB_00425824:
      bVar3 = false;
    }
    if ((bVar3) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (bVar7 != false) {
      this_02 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(pTVar6->GT);
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                (&local_90,this_02,pTVar6->GT);
      doc._M_dataplus._M_p = &DAT_00000001;
      doc._M_string_length = (size_type)&doc.field_2;
      doc.field_2._M_local_buf[0] = '/';
      local_e0._M_len = local_90._M_string_length;
      local_e0._M_str = local_90._M_dataplus._M_p;
      local_d0 = 1;
      local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)doc._M_string_length;
      local_c0 = strlen(pass);
      views_00._M_len = 3;
      views_00._M_array = &local_e0;
      local_b8 = pass;
      cmCatViews_abi_cxx11_(&tname,views_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                 &tname);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)tname._M_dataplus._M_p != &tname.field_2) {
        operator_delete(tname._M_dataplus._M_p,tname.field_2._M_allocated_capacity + 1);
      }
    }
    pTVar6 = pTVar6 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3& rootLG,
  DirectoryTarget const& dt, const char* pass, bool check_all,
  bool check_relink, std::vector<std::string> const& commands)
{
  auto* lg = static_cast<cmLocalUnixMakefileGenerator3*>(dt.LG);
  std::string makeTarget =
    cmStrCat(lg->GetCurrentBinaryDirectory(), '/', pass);

  // The directory-level rule should depend on the target-level rules
  // for all targets in the directory.
  std::vector<std::string> depends;
  for (DirectoryTarget::Target const& t : dt.Targets) {
    // Add this to the list of depends rules in this directory.
    if ((!check_all || t.ExcludedFromAllInConfigs.empty()) &&
        (!check_relink ||
         t.GT->NeedRelinkBeforeInstall(lg->GetConfigName()))) {
      // The target may be from a different directory; use its local gen.
      auto const* tlg = static_cast<cmLocalUnixMakefileGenerator3 const*>(
        t.GT->GetLocalGenerator());
      std::string tname =
        cmStrCat(tlg->GetRelativeTargetDirectory(t.GT), '/', pass);
      depends.push_back(std::move(tname));
    }
  }

  // The directory-level rule should depend on the directory-level
  // rules of the subdirectories.
  for (DirectoryTarget::Dir const& d : dt.Children) {
    if (check_all && d.ExcludeFromAll) {
      continue;
    }
    std::string subdir = cmStrCat(d.Path, '/', pass);
    depends.push_back(std::move(subdir));
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  if (depends.empty() && !this->EmptyRuleHackDepends.empty()) {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write the rule.
  std::string doc;
  if (lg->IsRootMakefile()) {
    doc = cmStrCat("The main recursive \"", pass, "\" target.");
  } else {
    doc = cmStrCat("Recursive \"", pass, "\" directory target.");
  }

  rootLG.WriteMakeRule(ruleFileStream, doc.c_str(), makeTarget, depends,
                       commands, true);
}